

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall
AlternativeLoader::altValidateTerritoriesLine
          (AlternativeLoader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,bool verbose)

{
  size_type sVar1;
  ostream *poVar2;
  bool verbose_local;
  bool *validMap_local;
  int *lineCount_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lineWords_local;
  AlternativeLoader *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(lineWords);
  if (sVar1 < 5) {
    if (verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*lineCount);
      std::operator<<(poVar2,
                      " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n"
                     );
    }
    *validMap = false;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AlternativeLoader::altValidateTerritoriesLine(std::vector<std::string> *lineWords, const int *lineCount,
                                              bool *validMap,bool verbose) {
    //check validity of the line in this mode
    if (lineWords->size() < 5) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    }
    return true;
}